

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  undefined8 *puVar1;
  int in_ESI;
  long in_RDI;
  my_master_ptr master;
  j_compress_ptr in_stack_00000a50;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x38);
  *(undefined8 **)(in_RDI + 0x1b0) = puVar1;
  *puVar1 = prepare_for_pass;
  puVar1[1] = pass_startup;
  puVar1[2] = finish_pass_master;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0;
  initial_setup(cinfo,transcode_only);
  if (*(long *)(in_RDI + 0xf8) == 0) {
    *(undefined4 *)(in_RDI + 0x134) = 0;
    *(undefined4 *)(in_RDI + 0xf0) = 1;
  }
  else {
    validate_script(in_stack_00000a50);
  }
  if ((*(int *)(in_RDI + 0x134) != 0) && (*(int *)(in_RDI + 0x104) == 0)) {
    *(undefined4 *)(in_RDI + 0x108) = 1;
  }
  if (in_ESI == 0) {
    *(undefined4 *)(puVar1 + 4) = 0;
  }
  else if (*(int *)(in_RDI + 0x108) == 0) {
    *(undefined4 *)(puVar1 + 4) = 2;
  }
  else {
    *(undefined4 *)(puVar1 + 4) = 1;
  }
  *(undefined4 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  if (*(int *)(in_RDI + 0x108) == 0) {
    *(undefined4 *)(puVar1 + 5) = *(undefined4 *)(in_RDI + 0xf0);
  }
  else {
    *(int *)(puVar1 + 5) = *(int *)(in_RDI + 0xf0) << 1;
  }
  puVar1[6] = "libjpeg-turbo version 2.1.1 (build 20250502)";
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control(j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *)master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if (cinfo->progressive_mode && !cinfo->arith_code)  /*  TEMPORARY HACK ??? */
    cinfo->optimize_coding = TRUE; /* assume default tables no good for progressive mode */

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;

  master->jpeg_version = PACKAGE_NAME " version " VERSION " (build " BUILD ")";
}